

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

int Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::
    classic_rom_offset(void)

{
  return 0xc000;
}

Assistant:

static constexpr int classic_rom_offset() {
			switch(model) {
				case Model::SixteenK:
				case Model::FortyEightK:
				return 0x0000;

				case Model::OneTwoEightK:
				case Model::Plus2:
				return 0x4000;

				case Model::Plus2a:
				case Model::Plus3:
				return 0xc000;
			}
		}